

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O3

Cdr * __thiscall
eprosima::fastcdr::Cdr::deserializeArray(Cdr *this,int16_t *short_t,size_t numElements)

{
  char **ppcVar1;
  size_t __n;
  char *__src;
  NotEnoughMemoryException *this_00;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  char local_18 [8];
  
  pcVar3 = local_18;
  pcVar2 = (this->m_currentPosition).m_currentPosition;
  uVar4 = (ulong)((uint)(this->m_lastDataSize < 2) &
                 *(int *)&(this->m_alignPosition).m_currentPosition - (int)pcVar2);
  if ((ulong)((long)(this->m_lastPosition).m_currentPosition - (long)pcVar2) <
      uVar4 + numElements * 2) {
    this_00 = (NotEnoughMemoryException *)__cxa_allocate_exception(0x28);
    exception::NotEnoughMemoryException::NotEnoughMemoryException
              (this_00,&exception::NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
    __cxa_throw(this_00,&exception::NotEnoughMemoryException::typeinfo,
                exception::NotEnoughMemoryException::~NotEnoughMemoryException);
  }
  __n = numElements * 2;
  this->m_lastDataSize = 2;
  if (numElements == 0) {
    __src = pcVar2;
    if (this->m_swapBytes != false) {
      return this;
    }
  }
  else {
    (this->m_currentPosition).m_currentPosition = pcVar2 + uVar4;
    __src = pcVar2 + uVar4;
    if (this->m_swapBytes != false) {
      if ((long)__n < 1) {
        return this;
      }
      pcVar2 = pcVar2 + uVar4 + 1;
      do {
        (this->m_currentPosition).m_currentPosition = pcVar2;
        pcVar3[1] = pcVar2[-1];
        (this->m_currentPosition).m_currentPosition = pcVar2 + 1;
        *pcVar3 = *pcVar2;
        pcVar3 = pcVar3 + 2;
        pcVar2 = pcVar2 + 2;
      } while (pcVar3 < local_18 + __n);
      return this;
    }
  }
  memcpy(short_t,__src,__n);
  ppcVar1 = &(this->m_currentPosition).m_currentPosition;
  *ppcVar1 = *ppcVar1 + __n;
  return this;
}

Assistant:

Cdr& Cdr::deserializeArray(int16_t *short_t, size_t numElements)
{
    size_t align = alignment(sizeof(*short_t));
    size_t totalSize = sizeof(*short_t) * numElements;
    size_t sizeAligned = totalSize + align;

    if((m_lastPosition - m_currentPosition) >= sizeAligned)
    {
        // Save last datasize.
        m_lastDataSize = sizeof(*short_t);

        // Align if there are any elements
        if(numElements)
            makeAlign(align);

        if(m_swapBytes)
        {
            char *dst = reinterpret_cast<char*>(&short_t);
            char *end = dst + totalSize;

            for(; dst < end; dst += sizeof(*short_t))
            {
                m_currentPosition++ >> dst[1];
                m_currentPosition++ >> dst[0];
            }
        }
        else
        {
            m_currentPosition.rmemcopy(short_t, totalSize);
            m_currentPosition += totalSize;
        }

        return *this;
    }

    throw NotEnoughMemoryException(NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
}